

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeRemoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QDebug *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  undefined1 local_150 [24];
  undefined1 local_138 [24];
  QArrayDataPointer<char16_t> local_120;
  QDebug local_108;
  undefined1 local_100 [24];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined8 local_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8._0_4_ = None;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)local_d8,"changeInFlight",
                     "ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x3b0);
  if (!bVar2) goto LAB_0014413a;
  this->changeInFlight = RowsRemoved;
  lcModelTest();
  if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_d8._0_4_ = ColumnsMoved;
    local_d8._4_8_ = 0;
    local_d8._12_4_ = 0;
    local_d8._16_4_ = 0;
    local_d8._20_4_ = 0;
    local_d8._24_8_ = lcModelTest::category.name;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_108,"rowsAboutToBeRemoved");
    pQVar4 = QDebug::operator<<(pQVar4,"start=");
    pQVar4 = QDebug::operator<<(pQVar4,start);
    pQVar4 = QDebug::operator<<(pQVar4,"end=");
    pQVar4 = QDebug::operator<<(pQVar4,end);
    pQVar4 = QDebug::operator<<(pQVar4,"parent=");
    local_100._0_8_ = pQVar4->stream;
    *(int *)(local_100._0_8_ + 0x28) = *(int *)(local_100._0_8_ + 0x28) + 1;
    operator<<((Stream *)(local_100 + 8),(QModelIndex *)local_100);
    pQVar4 = QDebug::operator<<((QDebug *)(local_100 + 8),"parent data=");
    pQVar5 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,parent,0);
    QVariant::toString();
    pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_120);
    pQVar4 = QDebug::operator<<(pQVar4,"current count of parent=");
    pQVar5 = (this->model).wp.value;
    iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,parent);
    pQVar4 = QDebug::operator<<(pQVar4,iVar3);
    pQVar4 = QDebug::operator<<(pQVar4,"last before removal=");
    local_100._16_8_ = pQVar4->stream;
    *(int *)(local_100._16_8_ + 0x28) = *(int *)(local_100._16_8_ + 0x28) + 1;
    pQVar5 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar5 + 0x60))(local_138,pQVar5,start + -1,0,parent);
    operator<<((Stream *)local_e8,(QModelIndex *)(local_100 + 0x10));
    iVar3 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
    pQVar5 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar5 + 0x60))(local_150,pQVar5,start + -1,0,parent);
    if (iVar3 == 0) {
      pQVar5 = (QObject *)0x0;
    }
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_78,pQVar5,local_150,0);
    operator<<((QDebug *)(local_e8 + 8),(QVariant *)local_e8);
    QDebug::~QDebug((QDebug *)(local_e8 + 8));
    QVariant::~QVariant((QVariant *)&local_78);
    QDebug::~QDebug((QDebug *)local_e8);
    QDebug::~QDebug((QDebug *)(local_100 + 0x10));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    QVariant::~QVariant(&local_58);
    QDebug::~QDebug((QDebug *)(local_100 + 8));
    QDebug::~QDebug((QDebug *)local_100);
    QDebug::~QDebug(&local_108);
  }
  local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._16_8_ = 0;
  local_b8.shared = (PrivateShared *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = 2;
  local_98.shared = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  local_80 = 2;
  local_d8._0_4_ = parent->r;
  local_d8._4_8_ = *(undefined8 *)&parent->c;
  local_d8._12_4_ = *(undefined4 *)((long)&parent->i + 4);
  pQVar1 = (parent->m).ptr;
  local_d8._16_4_ = SUB84(pQVar1,0);
  local_d8._20_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
  pQVar5 = (this->model).wp.value;
  iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,parent);
  local_d8._24_4_ = iVar3;
  if (start < 1) {
LAB_0014401b:
    if (end < local_d8._24_4_ + -1) {
      pQVar5 = (this->model).wp.value;
      iVar3 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,parent);
      if (0 < iVar3) {
        local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_4_ = -0x55555556;
        local_78._4_4_ = -0x55555556;
        local_78._8_4_ = 0xaaaaaaaa;
        local_78._12_4_ = 0xaaaaaaaa;
        pQVar5 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar5 + 0x60))(&local_78,pQVar5,end + 1,0,parent);
        bVar2 = false;
        if ((-1 < (int)local_78._0_4_) && (bVar2 = false, -1 < (int)local_78._4_4_)) {
          bVar2 = (undefined1 *)local_78._16_8_ != (undefined1 *)0x0;
        }
        iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar2,(uchar *)"endIndex.isValid()",0x14fb13,
                       (uchar *)
                       "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                       ,0x3c3);
        if ((char)iVar3 == '\0') goto LAB_0014412d;
        pQVar5 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_78,0);
        QVariant::operator=((QVariant *)&local_98,&local_58);
        QVariant::~QVariant(&local_58);
      }
    }
    QList<QAbstractItemModelTesterPrivate::Changing>::
    emplaceBack<QAbstractItemModelTesterPrivate::Changing_const&>
              (&(this->remove).super_QList<QAbstractItemModelTesterPrivate::Changing>,
               (Changing *)local_d8);
  }
  else {
    pQVar5 = (this->model).wp.value;
    iVar3 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,parent);
    if (iVar3 < 1) goto LAB_0014401b;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_4_ = -0x55555556;
    local_78._4_4_ = -0x55555556;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    pQVar5 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar5 + 0x60))(&local_78,pQVar5,start + -1,0,parent);
    bVar2 = false;
    if ((-1 < (int)local_78._0_4_) && (bVar2 = false, -1 < (int)local_78._4_4_)) {
      bVar2 = (undefined1 *)local_78._16_8_ != (undefined1 *)0x0;
    }
    iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar2,(uchar *)"startIndex.isValid()",0x14fb13,
                   (uchar *)
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3be);
    if ((char)iVar3 != '\0') {
      pQVar5 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_78,0);
      QVariant::operator=((QVariant *)&local_b8,&local_58);
      QVariant::~QVariant(&local_58);
      goto LAB_0014401b;
    }
  }
LAB_0014412d:
  Changing::~Changing((Changing *)local_d8);
LAB_0014413a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsRemoved;

    qCDebug(lcModelTest) << "rowsAboutToBeRemoved"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before removal=" << model->index(start - 1, 0, parent) << model->data(model->index(start - 1, 0, parent));

    Changing c;
    c.parent = parent;
    c.oldSize = model->rowCount(parent);
    if (start > 0 && model->columnCount(parent) > 0) {
        const QModelIndex startIndex = model->index(start - 1, 0, parent);
        MODELTESTER_VERIFY(startIndex.isValid());
        c.last = model->data(startIndex);
    }
    if (end < c.oldSize - 1 && model->columnCount(parent) > 0) {
        const QModelIndex endIndex = model->index(end + 1, 0, parent);
        MODELTESTER_VERIFY(endIndex.isValid());
        c.next = model->data(endIndex);
    }

    remove.push(c);
}